

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCStress.h
# Opt level: O2

RecyclerTestObject * __thiscall Location::Get(Location *this)

{
  RecyclerTestObject *pRVar1;
  
  switch(this->type) {
  case Scanned:
  case Rooted:
  case Barrier:
    pRVar1 = *this->location;
    break;
  case Tagged:
    pRVar1 = Untag(*this->location);
    return pRVar1;
  case ImplicitRoot:
    if (*this->location != (RecyclerTestObject *)0x0) {
      pRVar1 = ImplicitRootHolder::GetReference((ImplicitRootHolder *)*this->location);
      return pRVar1;
    }
    pRVar1 = (RecyclerTestObject *)0x0;
    break;
  default:
    pRVar1 = (RecyclerTestObject *)0x0;
    DoVerify(false,"false",
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/GCStress/GCStress.h"
             ,0x6d);
  }
  return pRVar1;
}

Assistant:

RecyclerTestObject * Get()
    {
        switch (type)
        {
            case Type::Scanned:
                return *location;

            case Type::Rooted:
                return *location;

            case Type::Barrier:
                return *location;

            case Type::Tagged:
                return Untag(*location);

            case Type::ImplicitRoot:
                // The stored location actually contains a pointer to the ImplicitRootHolder
                ImplicitRootHolder * holder = (ImplicitRootHolder *)(*location);
                if (holder == nullptr)
                {
                    return nullptr;
                }

                return holder->GetReference();
        }

        // Shouldn't get here
        VerifyCondition(false);
        return nullptr;
    }